

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestWriter.cpp
# Opt level: O0

void __thiscall
OpenMD::RestWriter::writeRest
          (RestWriter *this,
          vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
          *restInfo)

{
  void *this_00;
  bool bVar1;
  pointer ppVar2;
  SnapshotManager *this_01;
  Snapshot *this_02;
  undefined8 uVar3;
  char *in_RSI;
  undefined8 *in_RDI;
  RealType RVar4;
  int sendBufferLength;
  char *recvBuffer;
  int recvLength;
  int i_1;
  int nProc;
  int primaryNode;
  const_iterator j;
  const_iterator i;
  stringstream ss;
  string second;
  string first;
  string buffer;
  MPI_Status istatus;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int local_2d4;
  char *local_2d0;
  int local_2c8;
  int local_2c4;
  int local_2c0 [2];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  _Self local_258;
  _Base_ptr local_250;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *local_248;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *local_240;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *local_238;
  _Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_> local_230;
  __normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
  local_228 [3];
  undefined1 local_210 [392];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined1 local_28 [40];
  
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::__cxx11::stringstream::stringstream((stringstream *)local_210);
  __gnu_cxx::
  __normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
  ::__normal_iterator(local_228);
  std::_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_>::
  _Rb_tree_const_iterator(&local_230);
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    local_240 = (map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 *)std::
                   vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                   ::begin((vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                            *)in_stack_fffffffffffffcc8);
    __gnu_cxx::
    __normal_iterator<std::map<int,std::pair<double,double>,std::less<int>,std::allocator<std::pair<int_const,std::pair<double,double>>>>const*,std::vector<std::map<int,std::pair<double,double>,std::less<int>,std::allocator<std::pair<int_const,std::pair<double,double>>>>,std::allocator<std::map<int,std::pair<double,double>,std::less<int>,std::allocator<std::pair<int_const,std::pair<double,double>>>>>>>
    ::
    __normal_iterator<std::map<int,std::pair<double,double>,std::less<int>,std::allocator<std::pair<int_const,std::pair<double,double>>>>*>
              ((__normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
                *)in_stack_fffffffffffffcd0,
               (__normal_iterator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
                *)in_stack_fffffffffffffcc8);
    local_228[0]._M_current = local_238;
    while( true ) {
      local_248 = (map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)std::
                     vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                     ::end((vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                            *)in_stack_fffffffffffffcc8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffcd0,
                         (__normal_iterator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffcc8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
      ::operator*(local_228);
      local_250 = (_Base_ptr)
                  std::
                  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                  ::begin(in_stack_fffffffffffffcc8);
      local_230._M_node = local_250;
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
        ::operator*(local_228);
        local_258._M_node =
             (_Base_ptr)
             std::
             map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
             ::end(in_stack_fffffffffffffcc8);
        bVar1 = std::operator!=(&local_230,&local_258);
        if (!bVar1) break;
        std::ios::clear(local_210 + (long)*(_func_int **)(local_210._0_8_ + -0x18),0);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_210 + 0x10);
        ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_>::
                 operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_>
                             *)in_stack_fffffffffffffcd0);
        std::ostream::operator<<(__rhs,(ppVar2->second).first);
        std::operator>>((istream *)local_210,local_68);
        std::ios::clear(local_210 + (long)*(_func_int **)(local_210._0_8_ + -0x18),0);
        ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_>::
                 operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_>
                             *)in_stack_fffffffffffffcd0);
        std::ostream::operator<<(local_210 + 0x10,(ppVar2->second).second);
        std::operator>>((istream *)local_210,local_88);
        std::operator+(in_RSI,__rhs);
        std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
        std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        std::__cxx11::string::operator+=(local_48,local_278);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_2b8);
        std::_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_int,_std::pair<double,_double>_>_> *)
                   in_stack_fffffffffffffcd0);
      }
      std::__cxx11::string::operator+=(local_48,"\n");
      __gnu_cxx::
      __normal_iterator<const_std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_*,_std::vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>_>
      ::operator++(local_228);
    }
  }
  local_2c0[1] = 0;
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    if (worldRank == 0) {
      this_00 = (void *)in_RDI[1];
      this_01 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
      this_02 = SnapshotManager::getCurrentSnapshot(this_01);
      RVar4 = Snapshot::getTime(this_02);
      std::ostream::operator<<(this_00,RVar4);
      std::operator<<((ostream *)in_RDI[1],local_48);
      MPI_Comm_size(&ompi_mpi_comm_world,local_2c0);
      for (local_2c4 = 1; local_2c4 < local_2c0[0]; local_2c4 = local_2c4 + 1) {
        MPI_Recv(&local_2c8,1,&ompi_mpi_int,local_2c4,0,&ompi_mpi_comm_world,local_28);
        local_2d0 = (char *)operator_new__((long)local_2c8);
        if (local_2d0 != (char *)0x0) {
          MPI_Recv(local_2d0,local_2c8,&ompi_mpi_char,local_2c4,0,&ompi_mpi_comm_world,local_28);
          if ((*(byte *)(in_RDI + 2) & 1) != 0) {
            std::operator<<((ostream *)in_RDI[1],local_2d0);
          }
          if (local_2d0 != (char *)0x0) {
            operator_delete__(local_2d0);
          }
        }
      }
      std::ostream::flush();
    }
    else {
      local_2d4 = std::__cxx11::string::size();
      local_2d4 = local_2d4 + 1;
      MPI_Send(&local_2d4,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
      uVar3 = std::__cxx11::string::c_str();
      MPI_Send(uVar3,local_2d4,&ompi_mpi_char,0,0,&ompi_mpi_comm_world);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_210);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void RestWriter::writeRest(
      std::vector<std::map<int, Restraint::RealPair>> restInfo) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

#ifndef IS_MPI
    if (createRestFile_)
      (*output_)
          << info_->getSnapshotManager()->getCurrentSnapshot()->getTime();

    // output some information about the molecules
    std::vector<std::map<int, Restraint::RealPair>>::const_iterator i;
    std::map<int, Restraint::RealPair>::const_iterator j;

    if (createRestFile_) {
      for (i = restInfo.begin(); i != restInfo.end(); ++i) {
        for (j = (*i).begin(); j != (*i).end(); ++j) {
          (*output_) << "\t" << (j->second).first << "\t" << (j->second).second;
        }
        (*output_) << std::endl;
      }
      (*output_).flush();
    }
#else
    std::string buffer, first, second;
    std::stringstream ss;

    std::vector<std::map<int, Restraint::RealPair>>::const_iterator i;
    std::map<int, Restraint::RealPair>::const_iterator j;

    if (createRestFile_) {
      for (i = restInfo.begin(); i != restInfo.end(); ++i) {
        for (j = (*i).begin(); j != (*i).end(); ++j) {
          ss.clear();
          ss << (j->second).first;
          ss >> first;
          ss.clear();
          ss << (j->second).second;
          ss >> second;
          buffer += ("\t" + first + "\t" + second);
        }
        buffer += "\n";
      }
    }

    const int primaryNode = 0;

    if (createRestFile_) {
      if (worldRank == primaryNode) {
        (*output_)
            << info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
        (*output_) << buffer;

        int nProc;
        MPI_Comm_size(MPI_COMM_WORLD, &nProc);
        for (int i = 1; i < nProc; ++i) {
          // receive the length of the string buffer that was
          // prepared by processor i

          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &istatus);
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, 0, MPI_COMM_WORLD,
                     &istatus);
            if (createRestFile_) (*output_) << recvBuffer;

            delete[] recvBuffer;
          }
        }
        (*output_).flush();
      } else {
        int sendBufferLength = buffer.size() + 1;
        MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR, primaryNode,
                 0, MPI_COMM_WORLD);
      }
    }
#endif  // is_mpi
  }